

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings.cpp
# Opt level: O1

ReadStatus __thiscall
PartiallyDownloadedBlock::FillBlock
          (PartiallyDownloadedBlock *this,CBlock *block,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *vtx_missing)

{
  CBlockHeader *this_00;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *this_01;
  long lVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  pointer psVar3;
  base_blob<256U> *pbVar4;
  undefined3 uVar5;
  bool bVar6;
  pointer psVar7;
  undefined8 *puVar8;
  CChainParams *pCVar9;
  Logger *pLVar10;
  undefined8 uVar11;
  CTransaction *__tmp;
  long lVar12;
  ulong uVar13;
  ReadStatus RVar14;
  CBlockHeader *pCVar15;
  BlockValidationState *pBVar16;
  ulong uVar17;
  ulong uVar18;
  long in_FS_OFFSET;
  byte bVar19;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  CheckBlockFn check_block;
  string local_108;
  string local_e8;
  BlockValidationState state;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_78;
  undefined1 auStack_60 [8];
  uint256 hash;
  
  bVar19 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->header).nBits == 0) {
LAB_004551c8:
    RVar14 = READ_STATUS_INVALID;
  }
  else {
    this_00 = &this->header;
    CBlockHeader::GetHash(&hash,this_00);
    local_78.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._8_8_ = 0;
    state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_allocated_capacity
         = 0;
    state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
    state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)0x0;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._8_8_ = 0;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity
         = 0;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)0x0;
    state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
    state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
    local_78.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_60._0_3_ = 0;
    pCVar15 = this_00;
    pBVar16 = &state;
    for (lVar12 = 10; lVar12 != 0; lVar12 = lVar12 + -1) {
      uVar11._0_4_ = pCVar15->nVersion;
      uVar11._4_1_ = (pCVar15->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0];
      uVar11._5_1_ = (pCVar15->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[1];
      uVar11._6_1_ = (pCVar15->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[2];
      uVar11._7_1_ = (pCVar15->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[3];
      (pBVar16->super_ValidationState<BlockValidationResult>).m_mode = (undefined4)uVar11;
      (pBVar16->super_ValidationState<BlockValidationResult>).m_result =
           (int)((ulong)uVar11 >> 0x20);
      pCVar15 = (CBlockHeader *)((long)pCVar15 + (ulong)bVar19 * -0x10 + 8);
      pBVar16 = (BlockValidationState *)((long)pBVar16 + (ulong)bVar19 * -0x10 + 8);
    }
    memmove(block,this_00,0x50);
    this_01 = &block->vtx;
    check_block.super__Function_base._M_functor._M_unused._M_object =
         (block->vtx).
         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    check_block.super__Function_base._M_functor._8_8_ =
         (block->vtx).
         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    check_block.super__Function_base._M_manager =
         (_Manager_type)
         (block->vtx).
         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (block->vtx).
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_78.
         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (block->vtx).
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_78.
         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (block->vtx).
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_78.
         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_78.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)&check_block);
    uVar5 = auStack_60._0_3_;
    block->m_checked_merkle_root = auStack_60[2];
    block->fChecked = (bool)auStack_60[0];
    block->m_checked_witness_commitment = (bool)auStack_60[1];
    auStack_60._0_3_ = uVar5;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector(&local_78);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::resize(this_01,(long)(this->txn_available).
                           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->txn_available).
                           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4);
    psVar7 = (this->txn_available).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->txn_available).
        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == psVar7) {
      uVar18 = 0;
    }
    else {
      lVar12 = 8;
      uVar13 = 0;
      uVar17 = 0;
      do {
        lVar2 = *(long *)((long)psVar7 + lVar12 + -8);
        if (lVar2 == 0) {
          psVar7 = (vtx_missing->
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(vtx_missing->
                            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)psVar7 >> 4) <=
              uVar17) goto LAB_004551c8;
          uVar18 = uVar17 + 1;
          psVar3 = (this_01->
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          psVar7 = psVar7 + uVar17;
          *(element_type **)((long)psVar3 + lVar12 + -8) =
               (psVar7->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&(psVar3->
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr + lVar12),
                     &(psVar7->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount);
        }
        else {
          puVar8 = (undefined8 *)
                   ((long)&(psVar7->
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr + lVar12);
          psVar7 = (this_01->
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          uVar11 = *puVar8;
          puVar8[-1] = 0;
          *puVar8 = 0;
          *(long *)((long)psVar7 + lVar12 + -8) = lVar2;
          this_02 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                     ((long)&(psVar7->
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr + lVar12);
          *(undefined8 *)
           ((long)&(psVar7->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr + lVar12) = uVar11;
          uVar18 = uVar17;
          if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
          }
        }
        uVar13 = uVar13 + 1;
        psVar7 = (this->txn_available).
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar12 = lVar12 + 0x10;
        uVar17 = uVar18;
      } while (uVar13 < (ulong)((long)(this->txn_available).
                                      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7 >> 4
                               ));
    }
    *(undefined8 *)((this->header).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1c) = 0;
    (this->header).nBits = 0;
    (this->header).nNonce = 0;
    pbVar4 = &(this->header).hashMerkleRoot.super_base_blob<256U>;
    (pbVar4->m_data)._M_elems[0xc] = '\0';
    (pbVar4->m_data)._M_elems[0xd] = '\0';
    (pbVar4->m_data)._M_elems[0xe] = '\0';
    (pbVar4->m_data)._M_elems[0xf] = '\0';
    (pbVar4->m_data)._M_elems[0x10] = '\0';
    (pbVar4->m_data)._M_elems[0x11] = '\0';
    (pbVar4->m_data)._M_elems[0x12] = '\0';
    (pbVar4->m_data)._M_elems[0x13] = '\0';
    pbVar4 = &(this->header).hashMerkleRoot.super_base_blob<256U>;
    (pbVar4->m_data)._M_elems[0x14] = '\0';
    (pbVar4->m_data)._M_elems[0x15] = '\0';
    (pbVar4->m_data)._M_elems[0x16] = '\0';
    (pbVar4->m_data)._M_elems[0x17] = '\0';
    (pbVar4->m_data)._M_elems[0x18] = '\0';
    (pbVar4->m_data)._M_elems[0x19] = '\0';
    (pbVar4->m_data)._M_elems[0x1a] = '\0';
    (pbVar4->m_data)._M_elems[0x1b] = '\0';
    *(undefined8 *)((this->header).hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0x1c) = 0;
    pbVar4 = &(this->header).hashMerkleRoot.super_base_blob<256U>;
    (pbVar4->m_data)._M_elems[4] = '\0';
    (pbVar4->m_data)._M_elems[5] = '\0';
    (pbVar4->m_data)._M_elems[6] = '\0';
    (pbVar4->m_data)._M_elems[7] = '\0';
    (pbVar4->m_data)._M_elems[8] = '\0';
    (pbVar4->m_data)._M_elems[9] = '\0';
    (pbVar4->m_data)._M_elems[10] = '\0';
    (pbVar4->m_data)._M_elems[0xb] = '\0';
    pbVar4 = &(this->header).hashPrevBlock.super_base_blob<256U>;
    (pbVar4->m_data)._M_elems[0xc] = '\0';
    (pbVar4->m_data)._M_elems[0xd] = '\0';
    (pbVar4->m_data)._M_elems[0xe] = '\0';
    (pbVar4->m_data)._M_elems[0xf] = '\0';
    (pbVar4->m_data)._M_elems[0x10] = '\0';
    (pbVar4->m_data)._M_elems[0x11] = '\0';
    (pbVar4->m_data)._M_elems[0x12] = '\0';
    (pbVar4->m_data)._M_elems[0x13] = '\0';
    pbVar4 = &(this->header).hashPrevBlock.super_base_blob<256U>;
    (pbVar4->m_data)._M_elems[0x14] = '\0';
    (pbVar4->m_data)._M_elems[0x15] = '\0';
    (pbVar4->m_data)._M_elems[0x16] = '\0';
    (pbVar4->m_data)._M_elems[0x17] = '\0';
    (pbVar4->m_data)._M_elems[0x18] = '\0';
    (pbVar4->m_data)._M_elems[0x19] = '\0';
    (pbVar4->m_data)._M_elems[0x1a] = '\0';
    (pbVar4->m_data)._M_elems[0x1b] = '\0';
    this_00->nVersion = 0;
    (this_00->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0] = '\0';
    (this_00->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[1] = '\0';
    (this_00->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[2] = '\0';
    (this_00->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[3] = '\0';
    pbVar4 = &(this->header).hashPrevBlock.super_base_blob<256U>;
    (pbVar4->m_data)._M_elems[4] = '\0';
    (pbVar4->m_data)._M_elems[5] = '\0';
    (pbVar4->m_data)._M_elems[6] = '\0';
    (pbVar4->m_data)._M_elems[7] = '\0';
    (pbVar4->m_data)._M_elems[8] = '\0';
    (pbVar4->m_data)._M_elems[9] = '\0';
    (pbVar4->m_data)._M_elems[10] = '\0';
    (pbVar4->m_data)._M_elems[0xb] = '\0';
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::clear(&this->txn_available);
    RVar14 = READ_STATUS_INVALID;
    if ((long)(vtx_missing->
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(vtx_missing->
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              )._M_impl.super__Vector_impl_data._M_start >> 4 == uVar18) {
      state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
           (pointer)&state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2;
      state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
      state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
      state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
      state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
      _M_allocated_capacity =
           state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
           _M_allocated_capacity & 0xffffffffffffff00;
      state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
           (pointer)&state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
      state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
      state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2.
      _M_allocated_capacity =
           state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2.
           _M_allocated_capacity & 0xffffffffffffff00;
      if ((this->m_check_block_mock).super__Function_base._M_manager == (_Manager_type)0x0) {
        check_block.super__Function_base._M_functor._8_8_ = 0;
        check_block.super__Function_base._M_functor._M_unused._M_object = CheckBlock;
        check_block._M_invoker =
             std::
             _Function_handler<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool),_bool_(*)(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>
             ::_M_invoke;
        check_block.super__Function_base._M_manager =
             std::
             _Function_handler<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool),_bool_(*)(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>
             ::_M_manager;
      }
      else {
        std::
        function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>
        ::function(&check_block,&this->m_check_block_mock);
      }
      pCVar9 = Params();
      local_e8._M_dataplus._M_p._0_1_ = 1;
      local_108._M_dataplus._M_p._0_1_ = 1;
      if (check_block.super__Function_base._M_manager == (_Manager_type)0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          uVar11 = std::__throw_bad_function_call();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_e8._M_dataplus._M_p._1_7_,local_e8._M_dataplus._M_p._0_1_) !=
              &local_e8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_e8._M_dataplus._M_p._1_7_,local_e8._M_dataplus._M_p._0_1_
                                    ),local_e8.field_2._M_allocated_capacity + 1);
          }
          if (check_block.super__Function_base._M_manager != (_Manager_type)0x0) {
            (*check_block.super__Function_base._M_manager)
                      ((_Any_data *)&check_block,(_Any_data *)&check_block,__destroy_functor);
          }
          ValidationState<BlockValidationResult>::~ValidationState
                    (&state.super_ValidationState<BlockValidationResult>);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            _Unwind_Resume(uVar11);
          }
        }
        goto LAB_004555f9;
      }
      bVar6 = (*check_block._M_invoker)
                        ((_Any_data *)&check_block,block,&state,&pCVar9->consensus,(bool *)&local_e8
                         ,(bool *)&local_108);
      if (bVar6) {
        pLVar10 = LogInstance();
        bVar6 = BCLog::Logger::WillLogCategoryLevel(pLVar10,CMPCTBLOCK,Debug);
        if (bVar6) {
          base_blob<256u>::ToString_abi_cxx11_(&local_e8,&hash);
          local_108._M_dataplus._M_p =
               (pointer)((long)(vtx_missing->
                               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(vtx_missing->
                               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 4);
          logging_function._M_str = "FillBlock";
          logging_function._M_len = 9;
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/blockencodings.cpp"
          ;
          source_file._M_len = 0x62;
          LogPrintFormatInternal<std::__cxx11::string,unsigned_long,unsigned_long,unsigned_long,unsigned_long>
                    (logging_function,source_file,0xdc,CMPCTBLOCK,Debug,
                     (ConstevalFormatString<5U>)0x829b50,&local_e8,&this->prefilled_count,
                     &this->mempool_count,&this->extra_count,(unsigned_long *)&local_108);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_e8._M_dataplus._M_p._1_7_,local_e8._M_dataplus._M_p._0_1_) !=
              &local_e8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_e8._M_dataplus._M_p._1_7_,local_e8._M_dataplus._M_p._0_1_
                                    ),local_e8.field_2._M_allocated_capacity + 1);
          }
        }
        psVar7 = (vtx_missing->
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        psVar3 = (vtx_missing->
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        RVar14 = READ_STATUS_OK;
        if ((ulong)((long)psVar3 - (long)psVar7) < 0x41 && psVar3 != psVar7) {
          do {
            pLVar10 = LogInstance();
            bVar6 = BCLog::Logger::WillLogCategoryLevel(pLVar10,CMPCTBLOCK,Debug);
            if (bVar6) {
              base_blob<256u>::ToString_abi_cxx11_(&local_e8,&hash);
              base_blob<256u>::ToString_abi_cxx11_
                        (&local_108,
                         &((psVar7->
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->hash);
              logging_function_00._M_str = "FillBlock";
              logging_function_00._M_len = 9;
              source_file_00._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/blockencodings.cpp"
              ;
              source_file_00._M_len = 0x62;
              LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                        (logging_function_00,source_file_00,0xdf,CMPCTBLOCK,Debug,
                         (ConstevalFormatString<2U>)0x829bdc,&local_e8,&local_108);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_108._M_dataplus._M_p != &local_108.field_2) {
                operator_delete(local_108._M_dataplus._M_p,
                                local_108.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_e8._M_dataplus._M_p._1_7_,local_e8._M_dataplus._M_p._0_1_) !=
                  &local_e8.field_2) {
                operator_delete((undefined1 *)
                                CONCAT71(local_e8._M_dataplus._M_p._1_7_,
                                         local_e8._M_dataplus._M_p._0_1_),
                                local_e8.field_2._M_allocated_capacity + 1);
              }
            }
            psVar7 = psVar7 + 1;
            RVar14 = READ_STATUS_OK;
          } while (psVar7 != psVar3);
        }
      }
      else {
        RVar14 = state.super_ValidationState<BlockValidationResult>.m_result == BLOCK_MUTATED ^
                 READ_STATUS_CHECKBLOCK_FAILED;
      }
      if (check_block.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*check_block.super__Function_base._M_manager)
                  ((_Any_data *)&check_block,(_Any_data *)&check_block,__destroy_functor);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p !=
          &state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2) {
        operator_delete(state.super_ValidationState<BlockValidationResult>.m_debug_message.
                        _M_dataplus._M_p,
                        state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2.
                        _M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p !=
          &state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2) {
        operator_delete(state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                        _M_dataplus._M_p,
                        state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
                        _M_allocated_capacity + 1);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return RVar14;
  }
LAB_004555f9:
  __stack_chk_fail();
}

Assistant:

ReadStatus PartiallyDownloadedBlock::FillBlock(CBlock& block, const std::vector<CTransactionRef>& vtx_missing)
{
    if (header.IsNull()) return READ_STATUS_INVALID;

    uint256 hash = header.GetHash();
    block = header;
    block.vtx.resize(txn_available.size());

    size_t tx_missing_offset = 0;
    for (size_t i = 0; i < txn_available.size(); i++) {
        if (!txn_available[i]) {
            if (vtx_missing.size() <= tx_missing_offset)
                return READ_STATUS_INVALID;
            block.vtx[i] = vtx_missing[tx_missing_offset++];
        } else
            block.vtx[i] = std::move(txn_available[i]);
    }

    // Make sure we can't call FillBlock again.
    header.SetNull();
    txn_available.clear();

    if (vtx_missing.size() != tx_missing_offset)
        return READ_STATUS_INVALID;

    BlockValidationState state;
    CheckBlockFn check_block = m_check_block_mock ? m_check_block_mock : CheckBlock;
    if (!check_block(block, state, Params().GetConsensus(), /*fCheckPoW=*/true, /*fCheckMerkleRoot=*/true)) {
        // TODO: We really want to just check merkle tree manually here,
        // but that is expensive, and CheckBlock caches a block's
        // "checked-status" (in the CBlock?). CBlock should be able to
        // check its own merkle root and cache that check.
        if (state.GetResult() == BlockValidationResult::BLOCK_MUTATED)
            return READ_STATUS_FAILED; // Possible Short ID collision
        return READ_STATUS_CHECKBLOCK_FAILED;
    }

    LogDebug(BCLog::CMPCTBLOCK, "Successfully reconstructed block %s with %lu txn prefilled, %lu txn from mempool (incl at least %lu from extra pool) and %lu txn requested\n", hash.ToString(), prefilled_count, mempool_count, extra_count, vtx_missing.size());
    if (vtx_missing.size() < 5) {
        for (const auto& tx : vtx_missing) {
            LogDebug(BCLog::CMPCTBLOCK, "Reconstructed block %s required tx %s\n", hash.ToString(), tx->GetHash().ToString());
        }
    }

    return READ_STATUS_OK;
}